

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O2

int wally_addr_segwit_from_bytes
              (uchar *bytes,size_t bytes_len,char *addr_family,uint32_t flags,char **output)

{
  size_t len2;
  uchar uVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  ulong uVar9;
  uint8_t uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  size_t push_size;
  size_t local_f0;
  uint8_t data [65];
  char result [90];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar7 = -2;
  if ((((output != (char **)0x0) && (bytes_len != 0)) && (bytes != (uchar *)0x0)) &&
     ((addr_family != (char *)0x0 && (flags == 0)))) {
    uVar1 = *bytes;
    if (uVar1 == '\0') {
      uVar10 = '\0';
    }
    else {
      if (0xf < (byte)(uVar1 + 0xaf)) {
        return -2;
      }
      uVar10 = uVar1 + 0xb0;
    }
    iVar2 = script_get_push_size_from_bytes(bytes + 1,bytes_len - 1,&push_size);
    if ((iVar2 == 0) && (((uVar10 != '\0' || (push_size == 0x20)) || (push_size == 0x14)))) {
      result[0] = '\0';
      local_f0 = 0;
      len2 = bytes_len - 2;
      if ((bytes_len - 0x2b < 0xffffffffffffffd9) ||
         ((len2 != 0x14 && len2 != 0x20) && uVar10 == '\0')) {
        wally_clear_2(data,0x41,bytes + 2,len2);
      }
      else {
        data[0] = uVar10;
        convert_bits(data + 1,&local_f0,5,bytes + 2,len2,8,1);
        lVar12 = local_f0 + 1;
        uVar9 = local_f0 + 8;
        uVar3 = 1;
        for (pbVar8 = (byte *)addr_family; bVar5 = *pbVar8, bVar5 != 0; pbVar8 = pbVar8 + 1) {
          if (((byte)(bVar5 + 0x81) < 0xa2) || ((byte)(bVar5 + 0xbf) < 0x1a)) goto LAB_0012da84;
          uVar3 = bech32_polymod_step(uVar3);
          uVar3 = bVar5 >> 5 ^ uVar3;
          uVar9 = uVar9 + 1;
        }
        if (uVar9 < 0x5b) {
          uVar3 = bech32_polymod_step(uVar3);
          pbVar8 = (byte *)result;
          for (; bVar5 = *addr_family, bVar5 != 0; addr_family = (char *)((byte *)addr_family + 1))
          {
            uVar3 = bech32_polymod_step(uVar3);
            uVar3 = bVar5 & 0x1f ^ uVar3;
            *pbVar8 = bVar5;
            pbVar8 = pbVar8 + 1;
          }
          *pbVar8 = 0x31;
          lVar11 = 0;
          while( true ) {
            if (lVar12 == lVar11) {
              lVar12 = 6;
              while (bVar13 = lVar12 != 0, lVar12 = lVar12 + -1, bVar13) {
                uVar3 = bech32_polymod_step(uVar3);
              }
              uVar6 = 0x2bc830a3;
              if (uVar10 == '\0') {
                uVar6 = 1;
              }
              bVar5 = 0x19;
              for (lVar12 = 1; lVar12 != 7; lVar12 = lVar12 + 1) {
                pbVar8[lVar11 + lVar12] =
                     "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[(uVar3 ^ uVar6) >> (bVar5 & 0x1f) & 0x1f];
                bVar5 = bVar5 - 5;
              }
              pbVar8[lVar11 + 7] = 0;
              pcVar4 = wally_strdup(result);
              *output = pcVar4;
              wally_clear(result,0x5a);
              return (uint)(*output != (char *)0x0) * 3 + -3;
            }
            bVar5 = data[lVar11];
            if (0x1f < bVar5) break;
            uVar3 = bech32_polymod_step(uVar3);
            uVar3 = uVar3 ^ bVar5;
            pbVar8[lVar11 + 1] = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[bVar5];
            lVar11 = lVar11 + 1;
          }
        }
      }
LAB_0012da84:
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

int wally_addr_segwit_from_bytes(const unsigned char *bytes, size_t bytes_len,
                                 const char *addr_family, uint32_t flags,
                                 char **output)
{
    char result[90];
    size_t push_size;
    int ret;
    uint8_t witness_version;

    if (output)
        *output = 0;

    if (!addr_family || flags || !bytes || !bytes_len || !output)
        return WALLY_EINVAL;

    if (bytes[0] == 0)
        witness_version = 0;
    else if (bytes[0] >= OP_1 && bytes[0] <= OP_16)
        witness_version = bytes[0] - (OP_1 - 1);
    else
        return WALLY_EINVAL;

    ret = script_get_push_size_from_bytes(bytes + 1, bytes_len - 1, &push_size);
    if (ret != WALLY_OK)
        return WALLY_EINVAL;
    else if (witness_version == 0 && push_size != HASH160_LEN && push_size != SHA256_LEN)
        return WALLY_EINVAL;

    result[0] = '\0';
    if (!segwit_addr_encode(result, addr_family, witness_version, bytes + 2, bytes_len - 2))
        return WALLY_ERROR;

    *output = wally_strdup(result);
    wally_clear(result, sizeof(result));
    return *output ? WALLY_OK : WALLY_ENOMEM;
}